

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluDefs.cpp
# Opt level: O3

void __thiscall eglu::BadAllocError::BadAllocError(BadAllocError *this,char *errStr)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,errStr,&local_31);
  tcu::ResourceError::ResourceError(&this->super_ResourceError,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)&(this->super_ResourceError).super_TestException.super_Exception =
       &PTR__Exception_00b26060;
  return;
}

Assistant:

BadAllocError::BadAllocError (const char* errStr)
	: tcu::ResourceError(errStr)
{
}